

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

IdentifierPath * __thiscall
soul::IdentifierPath::fromSecondPart(IdentifierPath *__return_storage_ptr__,IdentifierPath *this)

{
  size_t sVar1;
  Identifier *item;
  ulong local_28;
  size_t i;
  IdentifierPath *this_local;
  IdentifierPath *p;
  
  sVar1 = size(this);
  checkAssertion(1 < sVar1,"size() > 1","fromSecondPart",0xf5);
  IdentifierPath(__return_storage_ptr__);
  for (local_28 = 1;
      sVar1 = ArrayWithPreallocation<soul::Identifier,_8UL>::size(&this->pathSections),
      local_28 < sVar1; local_28 = local_28 + 1) {
    item = ArrayWithPreallocation<soul::Identifier,_8UL>::operator[](&this->pathSections,local_28);
    ArrayWithPreallocation<soul::Identifier,_8UL>::push_back
              (&__return_storage_ptr__->pathSections,item);
  }
  return __return_storage_ptr__;
}

Assistant:

IdentifierPath fromSecondPart() const
    {
        SOUL_ASSERT (size() > 1);
        IdentifierPath p;

        for (size_t i = 1; i < pathSections.size(); ++i)
            p.pathSections.push_back (pathSections[i]);

        return p;
    }